

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmAuxSourceDirectoryCommand::Clone(cmAuxSourceDirectoryCommand *this)

{
  cmCommand *this_00;
  cmAuxSourceDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmAuxSourceDirectoryCommand((cmAuxSourceDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmAuxSourceDirectoryCommand;
    }